

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O2

int olsrv2_routing_init(void)

{
  int iVar1;
  long lVar2;
  
  iVar1 = os_core_linux_get_random(&_ansn,2);
  if (iVar1 == 0) {
    nhdp_domain_listener_add(&_nhdp_listener);
    _domain_changed[0] = false;
    _domain_changed[1] = false;
    _domain_changed[2] = false;
    _domain_changed[3] = false;
    _update_ansn = false;
    oonf_class_add(&_rtset_entry);
    oonf_timer_add(&_dijkstra_timer_info);
    for (lVar2 = 0; lVar2 != 0xa0; lVar2 = lVar2 + 0x28) {
      avl_init((long)&_routing_tree[0].list_head.next + lVar2,os_routing_avl_cmp_route_key,0);
    }
    _routing_filter_list.prev = &_routing_filter_list;
    _routing_filter_list.next = &_routing_filter_list;
    avl_init(&_dijkstra_working_tree,avl_comp_uint32,1);
    _kernel_queue.prev = &_kernel_queue;
    _kernel_queue.next = &_kernel_queue;
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
olsrv2_routing_init(void) {
  int i;

  /* initialize domain change tracker */
  if (os_core_get_random(&_ansn, sizeof(_ansn))) {
    return -1;
  }

  nhdp_domain_listener_add(&_nhdp_listener);
  memset(_domain_changed, 0, sizeof(_domain_changed));
  _update_ansn = false;

  oonf_class_add(&_rtset_entry);
  oonf_timer_add(&_dijkstra_timer_info);

  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    avl_init(&_routing_tree[i], os_routing_avl_cmp_route_key, false);
  }
  list_init_head(&_routing_filter_list);
  avl_init(&_dijkstra_working_tree, avl_comp_uint32, true);
  list_init_head(&_kernel_queue);

  return 0;
}